

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

int32_t GetCheckRatio(NodeContext *node_ctx)

{
  ArgsManager *this;
  int32_t iVar1;
  int64_t iVar2;
  int iVar3;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = node_ctx->args;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"-checkaddrman","");
  iVar2 = ArgsManager::GetIntArg(this,&local_40,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar3 = 1000000;
  if ((int)iVar2 < 1000000) {
    iVar3 = (int)iVar2;
  }
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int32_t GetCheckRatio(const NodeContext& node_ctx)
{
    return std::clamp<int32_t>(node_ctx.args->GetIntArg("-checkaddrman", 100), 0, 1000000);
}